

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,u32 iLabel)

{
  byte bVar1;
  int iVar2;
  u32 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint i_00;
  u32 uVar7;
  u32 in_ECX;
  char *in_RDX;
  u32 in_ESI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  uint nn;
  u32 nIns;
  u32 v;
  char *zLabel;
  int rawLabel;
  int rawKey;
  u8 x;
  char *zKey;
  u32 rc;
  u32 iEnd;
  u32 n;
  u32 nKey;
  u32 k;
  u32 j;
  u32 i;
  JsonParse v_2;
  JsonParse ix;
  JsonParse v_1;
  u32 sz;
  undefined4 in_stack_fffffffffffffe98;
  u32 in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  u32 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffea9;
  undefined1 in_stack_fffffffffffffeaa;
  uint in_stack_fffffffffffffeab;
  undefined3 uVar9;
  u8 in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffeb4;
  char *local_130;
  uint local_11c;
  u32 local_118;
  uint uVar11;
  char *pcVar12;
  undefined4 in_stack_ffffffffffffff00;
  u32 local_ec;
  undefined1 local_e8 [72];
  void *local_a0;
  uint local_98;
  sqlite3 *local_88;
  byte local_71;
  void *local_58;
  uint local_50;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  if (*in_RDX == '\0') {
    if ((in_RDI->eEdit != '\0') &&
       (iVar2 = jsonBlobMakeEditable
                          ((JsonParse *)
                           CONCAT17(in_stack_fffffffffffffeaf,
                                    CONCAT43(in_stack_fffffffffffffeab,
                                             CONCAT12(in_stack_fffffffffffffeaa,
                                                      CONCAT11(in_stack_fffffffffffffea9,
                                                               in_stack_fffffffffffffea8)))),
                           in_stack_fffffffffffffea4), iVar2 != 0)) {
      uVar3 = jsonbPayloadSize(in_RDI,in_ESI,&local_c);
      local_c = uVar3 + local_c;
      uVar9 = (undefined3)(in_stack_fffffffffffffeab >> 8);
      if (in_RDI->eEdit == '\x01') {
        if (in_ECX != 0) {
          local_c = (in_ESI - in_ECX) + local_c;
          in_ESI = in_ECX;
        }
        jsonBlobEdit((JsonParse *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     CONCAT13(in_stack_fffffffffffffeaf,uVar9),
                     CONCAT13((char)in_stack_fffffffffffffeab,
                              CONCAT12(in_stack_fffffffffffffeaa,
                                       CONCAT11(in_stack_fffffffffffffea9,in_stack_fffffffffffffea8)
                                      )),
                     (u8 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c);
      }
      else if (in_RDI->eEdit != '\x03') {
        jsonBlobEdit((JsonParse *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     CONCAT13(in_stack_fffffffffffffeaf,uVar9),
                     CONCAT13((char)in_stack_fffffffffffffeab,
                              CONCAT12(in_stack_fffffffffffffeaa,
                                       CONCAT11(in_stack_fffffffffffffea9,in_stack_fffffffffffffea8)
                                      )),
                     (u8 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c);
      }
    }
    in_RDI->iLabel = in_ECX;
    local_ec = in_ESI;
    goto LAB_00231fb9;
  }
  if (*in_RDX == '.') {
    bVar1 = in_RDI->aBlob[in_ESI];
    local_130 = in_RDX + 1;
    pcVar12 = local_130;
    if (*local_130 == '\"') {
      uVar11 = 1;
      uVar4 = in_stack_fffffffffffffeab;
      while( true ) {
        in_stack_fffffffffffffeab = uVar4 & 0xffffff00;
        if (local_130[uVar11] != '\0') {
          in_stack_fffffffffffffeab = CONCAT31((int3)(uVar4 >> 8),local_130[uVar11] != '\"');
        }
        if ((char)in_stack_fffffffffffffeab == '\0') break;
        if ((local_130[uVar11] == '\\') && (local_130[uVar11 + 1] != '\0')) {
          uVar11 = uVar11 + 1;
        }
        uVar11 = uVar11 + 1;
        uVar4 = in_stack_fffffffffffffeab;
      }
      local_11c = uVar11 - 1;
      if (local_130[uVar11] == '\0') {
        local_ec = 0xfffffffd;
        goto LAB_00231fb9;
      }
      uVar11 = uVar11 + 1;
      memchr(in_RDX + 2,0x5c,(ulong)local_11c);
      local_130 = in_RDX + 2;
    }
    else {
      local_11c = 0;
      while( true ) {
        bVar8 = false;
        if ((local_130[local_11c] != '\0') && (bVar8 = false, local_130[local_11c] != '.')) {
          bVar8 = local_130[local_11c] != '[';
        }
        if (!bVar8) break;
        local_11c = local_11c + 1;
      }
      if (local_11c == 0) {
        local_ec = 0xfffffffd;
        goto LAB_00231fb9;
      }
      in_stack_fffffffffffffeaa = 0;
      uVar11 = local_11c;
    }
    if ((bVar1 & 0xf) != 0xc) {
      local_ec = 0xfffffffe;
      goto LAB_00231fb9;
    }
    uVar3 = jsonbPayloadSize(in_RDI,in_ESI,&local_c);
    uVar4 = in_ESI + uVar3;
    uVar5 = uVar4 + local_c;
    for (; uVar4 < uVar5; uVar4 = uVar3 + local_c + uVar4) {
      bVar1 = in_RDI->aBlob[uVar4] & 0xf;
      if ((bVar1 < 7) || (10 < bVar1)) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
      uVar3 = jsonbPayloadSize(in_RDI,uVar4,&local_c);
      if (uVar3 == 0) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
      iVar2 = uVar4 + uVar3;
      if (uVar5 <= iVar2 + local_c) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
      in_stack_fffffffffffffea9 = bVar1 == 7 || bVar1 == 10;
      iVar6 = jsonLabelCompare((char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                CONCAT43(in_stack_fffffffffffffeab,
                                                         CONCAT12(in_stack_fffffffffffffeaa,
                                                                  CONCAT11(in_stack_fffffffffffffea9
                                                                           ,
                                                  in_stack_fffffffffffffea8)))),
                               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                               ,0,0x2318b3);
      uVar3 = (u32)((ulong)pcVar12 >> 0x20);
      if (iVar6 != 0) {
        i_00 = iVar2 + local_c;
        if ((in_RDI->aBlob[i_00] & 0xf) < 0xd) {
          uVar7 = jsonbPayloadSize(in_RDI,i_00,&local_c);
          if ((uVar7 == 0) || (uVar5 < i_00 + uVar7 + local_c)) {
            local_ec = 0xffffffff;
          }
          else {
            local_ec = jsonLookupStep((JsonParse *)CONCAT44(in_ESI,in_stack_ffffffffffffff00),uVar3,
                                      (char *)CONCAT44(in_ECX,uVar11),uVar4);
            if (in_RDI->delta != 0) {
              jsonAfterEditSizeAdjust
                        ((JsonParse *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         in_stack_fffffffffffffe9c);
            }
          }
        }
        else {
          local_ec = 0xffffffff;
        }
        goto LAB_00231fb9;
      }
      uVar4 = iVar2 + local_c;
      if (0xc < (in_RDI->aBlob[uVar4] & 0xf)) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
      uVar3 = jsonbPayloadSize(in_RDI,uVar4,&local_c);
      if (uVar3 == 0) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
    }
    if (uVar5 < uVar4) {
      local_ec = 0xffffffff;
      goto LAB_00231fb9;
    }
    if (2 < in_RDI->eEdit) {
      uVar10 = 0xaaaaaaaa;
      memset(&local_58,0xaa,0x48);
      memset(&local_a0,0xaa,0x48);
      memset(&local_a0,0,0x48);
      local_88 = in_RDI->db;
      jsonBlobAppendNode((JsonParse *)CONCAT44(in_stack_fffffffffffffeb4,uVar10),
                         in_stack_fffffffffffffeaf,
                         CONCAT13((char)in_stack_fffffffffffffeab,
                                  CONCAT12(in_stack_fffffffffffffeaa,
                                           CONCAT11(in_stack_fffffffffffffea9,
                                                    in_stack_fffffffffffffea8))),
                         (void *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      in_RDI->oom = in_RDI->oom | local_71;
      local_ec = jsonCreateEditSubstructure
                           ((JsonParse *)CONCAT44(in_stack_fffffffffffffeb4,uVar10),
                            (JsonParse *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT43(in_stack_fffffffffffffeab,
                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                       CONCAT11(in_stack_fffffffffffffea9,
                                                                in_stack_fffffffffffffea8)))),
                            (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (((local_ec < 0xfffffffd) &&
          (iVar2 = jsonBlobMakeEditable
                             ((JsonParse *)
                              CONCAT17(in_stack_fffffffffffffeaf,
                                       CONCAT43(in_stack_fffffffffffffeab,
                                                CONCAT12(in_stack_fffffffffffffeaa,
                                                         CONCAT11(in_stack_fffffffffffffea9,
                                                                  in_stack_fffffffffffffea8)))),
                              in_stack_fffffffffffffea4), iVar2 != 0)) &&
         (jsonBlobEdit((JsonParse *)
                       CONCAT44(in_stack_fffffffffffffeb4,local_98 + local_11c + local_50),
                       CONCAT13(in_stack_fffffffffffffeaf,(int3)(in_stack_fffffffffffffeab >> 8)),
                       CONCAT13((char)in_stack_fffffffffffffeab,
                                CONCAT12(in_stack_fffffffffffffeaa,
                                         CONCAT11(in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))),
                       (u8 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c), in_RDI->oom == '\0')) {
        memcpy(in_RDI->aBlob + uVar4,local_a0,(ulong)local_98);
        memcpy(in_RDI->aBlob + (uVar4 + local_98),local_130,(ulong)local_11c);
        memcpy(in_RDI->aBlob + (local_11c + uVar4 + local_98),local_58,(ulong)local_50);
        if (in_RDI->delta != 0) {
          jsonAfterEditSizeAdjust
                    ((JsonParse *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c);
        }
      }
      jsonParseReset((JsonParse *)0x231bf7);
      jsonParseReset((JsonParse *)0x231c04);
      goto LAB_00231fb9;
    }
  }
  else {
    if (*in_RDX != '[') {
      local_ec = 0xfffffffd;
      goto LAB_00231fb9;
    }
    if ((in_RDI->aBlob[in_ESI] & 0xf) != 0xb) {
      local_ec = 0xfffffffe;
      goto LAB_00231fb9;
    }
    uVar3 = jsonbPayloadSize(in_RDI,in_ESI,&local_c);
    local_118 = 0;
    uVar11 = 1;
    while ((""[(byte)in_RDX[uVar11]] & 4) != 0) {
      local_118 = (local_118 * 10 + (int)in_RDX[uVar11]) - 0x30;
      uVar11 = uVar11 + 1;
    }
    if ((uVar11 < 2) || (in_RDX[uVar11] != ']')) {
      if (in_RDX[1] != '#') {
        local_ec = 0xfffffffd;
        goto LAB_00231fb9;
      }
      local_118 = jsonbArrayCount((JsonParse *)
                                  CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                  CONCAT13(in_stack_fffffffffffffeaf,
                                           (int3)(in_stack_fffffffffffffeab >> 8)));
      uVar11 = 2;
      if ((in_RDX[2] == '-') && ((""[(byte)in_RDX[3]] & 4) != 0)) {
        in_stack_fffffffffffffeab = in_stack_fffffffffffffeab & 0xff;
        in_stack_fffffffffffffeaf = '\0';
        uVar11 = 3;
        do {
          uVar4 = (CONCAT13(in_stack_fffffffffffffeaf,(int3)(in_stack_fffffffffffffeab >> 8)) * 10 +
                  (int)in_RDX[uVar11]) - 0x30;
          in_stack_fffffffffffffeab = CONCAT31((int3)uVar4,(char)in_stack_fffffffffffffeab);
          in_stack_fffffffffffffeaf = (u8)(uVar4 >> 0x18);
          uVar11 = uVar11 + 1;
        } while ((""[(byte)in_RDX[uVar11]] & 4) != 0);
        if (local_118 < uVar4) {
          local_ec = 0xfffffffe;
          goto LAB_00231fb9;
        }
        local_118 = local_118 - uVar4;
      }
      if (in_RDX[uVar11] != ']') {
        local_ec = 0xfffffffd;
        goto LAB_00231fb9;
      }
    }
    uVar4 = in_ESI + uVar3;
    uVar5 = uVar4 + local_c;
    for (; uVar4 < uVar5; uVar4 = uVar3 + local_c + uVar4) {
      if (local_118 == 0) {
        local_ec = jsonLookupStep((JsonParse *)CONCAT44(in_ESI,in_stack_ffffffffffffff00),
                                  (u32)((ulong)in_RDX >> 0x20),(char *)CONCAT44(in_ECX,uVar11),uVar4
                                 );
        if (in_RDI->delta != 0) {
          jsonAfterEditSizeAdjust
                    ((JsonParse *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c);
        }
        goto LAB_00231fb9;
      }
      local_118 = local_118 - 1;
      uVar3 = jsonbPayloadSize(in_RDI,uVar4,&local_c);
      if (uVar3 == 0) {
        local_ec = 0xffffffff;
        goto LAB_00231fb9;
      }
    }
    if (uVar5 < uVar4) {
      local_ec = 0xffffffff;
      goto LAB_00231fb9;
    }
    if (local_118 != 0) {
      local_ec = 0xfffffffe;
      goto LAB_00231fb9;
    }
    if (2 < in_RDI->eEdit) {
      memset(local_e8,0xaa,0x48);
      local_ec = jsonCreateEditSubstructure
                           ((JsonParse *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            (JsonParse *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT43(in_stack_fffffffffffffeab,
                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                       CONCAT11(in_stack_fffffffffffffea9,
                                                                in_stack_fffffffffffffea8)))),
                            (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if ((local_ec < 0xfffffffd) &&
         (iVar2 = jsonBlobMakeEditable
                            ((JsonParse *)
                             CONCAT17(in_stack_fffffffffffffeaf,
                                      CONCAT43(in_stack_fffffffffffffeab,
                                               CONCAT12(in_stack_fffffffffffffeaa,
                                                        CONCAT11(in_stack_fffffffffffffea9,
                                                                 in_stack_fffffffffffffea8)))),
                             in_stack_fffffffffffffea4), iVar2 != 0)) {
        jsonBlobEdit((JsonParse *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     CONCAT13(in_stack_fffffffffffffeaf,(int3)(in_stack_fffffffffffffeab >> 8)),
                     CONCAT13((char)in_stack_fffffffffffffeab,
                              CONCAT12(in_stack_fffffffffffffeaa,
                                       CONCAT11(in_stack_fffffffffffffea9,in_stack_fffffffffffffea8)
                                      )),
                     (u8 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c);
      }
      jsonParseReset((JsonParse *)0x231f80);
      if (in_RDI->delta != 0) {
        jsonAfterEditSizeAdjust
                  ((JsonParse *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
      }
      goto LAB_00231fb9;
    }
  }
  local_ec = 0xfffffffe;
LAB_00231fb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ec;
  }
  __stack_chk_fail();
}

Assistant:

static u32 jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this element of aBlob[] */
  const char *zPath,      /* The path to search */
  u32 iLabel              /* Label if iRoot is a value of in an object */
){
  u32 i, j, k, nKey, sz, n, iEnd, rc;
  const char *zKey;
  u8 x;

  if( zPath[0]==0 ){
    if( pParse->eEdit && jsonBlobMakeEditable(pParse, pParse->nIns) ){
      n = jsonbPayloadSize(pParse, iRoot, &sz);
      sz += n;
      if( pParse->eEdit==JEDIT_DEL ){
        if( iLabel>0 ){
          sz += iRoot - iLabel;
          iRoot = iLabel;
        }
        jsonBlobEdit(pParse, iRoot, sz, 0, 0);
      }else if( pParse->eEdit==JEDIT_INS ){
        /* Already exists, so json_insert() is a no-op */
      }else{
        /* json_set() or json_replace() */
        jsonBlobEdit(pParse, iRoot, sz, pParse->aIns, pParse->nIns);
      }
    }
    pParse->iLabel = iLabel;
    return iRoot;
  }
  if( zPath[0]=='.' ){
    int rawKey = 1;
    x = pParse->aBlob[iRoot];
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){
        if( zPath[i]=='\\' && zPath[i+1]!=0 ) i++;
      }
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
      testcase( nKey==0 );
      rawKey = memchr(zKey, '\\', nKey)==0;
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        return JSON_LOOKUP_PATHERROR;
      }
    }
    if( (x & 0x0f)!=JSONB_OBJECT ) return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    j = iRoot + n;  /* j is the index of a label */
    iEnd = j+sz;
    while( j<iEnd ){
      int rawLabel;
      const char *zLabel;
      x = pParse->aBlob[j] & 0x0f;
      if( x<JSONB_TEXT || x>JSONB_TEXTRAW ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      k = j+n;  /* k is the index of the label text */
      if( k+sz>=iEnd ) return JSON_LOOKUP_ERROR;
      zLabel = (const char*)&pParse->aBlob[k];
      rawLabel = x==JSONB_TEXT || x==JSONB_TEXTRAW;
      if( jsonLabelCompare(zKey, nKey, rawKey, zLabel, sz, rawLabel) ){
        u32 v = k+sz;  /* v is the index of the value */
        if( ((pParse->aBlob[v])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
        n = jsonbPayloadSize(pParse, v, &sz);
        if( n==0 || v+n+sz>iEnd ) return JSON_LOOKUP_ERROR;
        assert( j>0 );
        rc = jsonLookupStep(pParse, v, &zPath[i], j);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      j = k+sz;
      if( ((pParse->aBlob[j])&0x0f)>JSONB_OBJECT ) return JSON_LOOKUP_ERROR;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( pParse->eEdit>=JEDIT_INS ){
      u32 nIns;          /* Total bytes to insert (label+value) */
      JsonParse v;       /* BLOB encoding of the value to be inserted */
      JsonParse ix;      /* Header of the label to be inserted */
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      memset(&ix, 0, sizeof(ix));
      ix.db = pParse->db;
      jsonBlobAppendNode(&ix, rawKey?JSONB_TEXTRAW:JSONB_TEXT5, nKey, 0);
      pParse->oom |= ix.oom;
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, ix.nBlob+nKey+v.nBlob)
      ){
        assert( !pParse->oom );
        nIns = ix.nBlob + nKey + v.nBlob;
        jsonBlobEdit(pParse, j, 0, 0, nIns);
        if( !pParse->oom ){
          assert( pParse->aBlob!=0 ); /* Because pParse->oom!=0 */
          assert( ix.aBlob!=0 );      /* Because pPasre->oom!=0 */
          memcpy(&pParse->aBlob[j], ix.aBlob, ix.nBlob);
          k = j + ix.nBlob;
          memcpy(&pParse->aBlob[k], zKey, nKey);
          k += nKey;
          memcpy(&pParse->aBlob[k], v.aBlob, v.nBlob);
          if( ALWAYS(pParse->delta) ) jsonAfterEditSizeAdjust(pParse, iRoot);
        }
      }
      jsonParseReset(&v);
      jsonParseReset(&ix);
      return rc;
    }
  }else if( zPath[0]=='[' ){
    x = pParse->aBlob[iRoot] & 0x0f;
    if( x!=JSONB_ARRAY )  return JSON_LOOKUP_NOTFOUND;
    n = jsonbPayloadSize(pParse, iRoot, &sz);
    k = 0;
    i = 1;
    while( sqlite3Isdigit(zPath[i]) ){
      k = k*10 + zPath[i] - '0';
      i++;
    }
    if( i<2 || zPath[i]!=']' ){
      if( zPath[1]=='#' ){
        k = jsonbArrayCount(pParse, iRoot);
        i = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int nn = 0;
          i = 3;
          do{
            nn = nn*10 + zPath[i] - '0';
            i++;
          }while( sqlite3Isdigit(zPath[i]) );
          if( nn>k ) return JSON_LOOKUP_NOTFOUND;
          k -= nn;
        }
        if( zPath[i]!=']' ){
          return JSON_LOOKUP_PATHERROR;
        }
      }else{
        return JSON_LOOKUP_PATHERROR;
      }
    }
    j = iRoot+n;
    iEnd = j+sz;
    while( j<iEnd ){
      if( k==0 ){
        rc = jsonLookupStep(pParse, j, &zPath[i+1], 0);
        if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
        return rc;
      }
      k--;
      n = jsonbPayloadSize(pParse, j, &sz);
      if( n==0 ) return JSON_LOOKUP_ERROR;
      j += n+sz;
    }
    if( j>iEnd ) return JSON_LOOKUP_ERROR;
    if( k>0 ) return JSON_LOOKUP_NOTFOUND;
    if( pParse->eEdit>=JEDIT_INS ){
      JsonParse v;
      testcase( pParse->eEdit==JEDIT_INS );
      testcase( pParse->eEdit==JEDIT_SET );
      rc = jsonCreateEditSubstructure(pParse, &v, &zPath[i+1]);
      if( !JSON_LOOKUP_ISERROR(rc)
       && jsonBlobMakeEditable(pParse, v.nBlob)
      ){
        assert( !pParse->oom );
        jsonBlobEdit(pParse, j, 0, v.aBlob, v.nBlob);
      }
      jsonParseReset(&v);
      if( pParse->delta ) jsonAfterEditSizeAdjust(pParse, iRoot);
      return rc;
    }
  }else{
    return JSON_LOOKUP_PATHERROR;
  }
  return JSON_LOOKUP_NOTFOUND;
}